

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O3

int crypt_init(LIBSSH2_SESSION *session,LIBSSH2_CRYPT_METHOD *method,uchar *iv,int *free_iv,
              uchar *secret,int *free_secret,int encrypt,void **abstract)

{
  _func_EVP_CIPHER_ptr *algo;
  int iVar1;
  int *piVar2;
  
  piVar2 = (int *)(*session->alloc)(0x18,&session->abstract);
  if (piVar2 == (int *)0x0) {
    iVar1 = -6;
  }
  else {
    *piVar2 = encrypt;
    algo = method->algo;
    *(_func_EVP_CIPHER_ptr **)(piVar2 + 2) = algo;
    iVar1 = _libssh2_cipher_init((EVP_CIPHER_CTX **)(piVar2 + 4),algo,iv,secret,encrypt);
    if (iVar1 == 0) {
      *abstract = piVar2;
      *free_iv = 1;
      *free_secret = 1;
      iVar1 = 0;
    }
    else {
      (*session->free)(piVar2,&session->abstract);
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static int
crypt_init(LIBSSH2_SESSION * session,
           const LIBSSH2_CRYPT_METHOD * method,
           unsigned char *iv, int *free_iv,
           unsigned char *secret, int *free_secret,
           int encrypt, void **abstract)
{
    struct crypt_ctx *ctx = LIBSSH2_ALLOC(session,
                                          sizeof(struct crypt_ctx));
    if (!ctx)
        return LIBSSH2_ERROR_ALLOC;

    ctx->encrypt = encrypt;
    ctx->algo = method->algo;
    if (_libssh2_cipher_init(&ctx->h, ctx->algo, iv, secret, encrypt)) {
        LIBSSH2_FREE(session, ctx);
        return -1;
    }
    *abstract = ctx;
    *free_iv = 1;
    *free_secret = 1;
    return 0;
}